

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# assertion_tests.c
# Opt level: O1

void double_differences_matter_past_significant_figures(void)

{
  undefined8 uVar1;
  
  significant_figures_for_assert_double_are(4);
  uVar1 = create_not_equal_to_double_constraint(0x3ff1d70a3d70a3d7,"1.115");
  assert_that_double_(0x3ff1ced916872b02,
                      "/workspace/llm4binary/github/license_c_cmakelists/cgreen-devs[P]cgreen/tests/assertion_tests.c"
                      ,0xdc,"1.113",uVar1);
  uVar1 = create_less_than_double_constraint(0x3ff1d70a3d70a3d7,"1.115");
  assert_that_double_(0x3ff1ced916872b02,
                      "/workspace/llm4binary/github/license_c_cmakelists/cgreen-devs[P]cgreen/tests/assertion_tests.c"
                      ,0xdd,"1.113",uVar1);
  uVar1 = create_greater_than_double_constraint(0x3ff1ced916872b02,"1.113");
  assert_that_double_(0x3ff1d70a3d70a3d7,
                      "/workspace/llm4binary/github/license_c_cmakelists/cgreen-devs[P]cgreen/tests/assertion_tests.c"
                      ,0xde,"1.115",uVar1);
  uVar1 = create_not_equal_to_double_constraint(0x40916c0000000000,"1115");
  assert_that_double_(0x4091640000000000,
                      "/workspace/llm4binary/github/license_c_cmakelists/cgreen-devs[P]cgreen/tests/assertion_tests.c"
                      ,0xdf,"1113",uVar1);
  uVar1 = create_not_equal_to_double_constraint(0x4131037800000000,"1115000");
  assert_that_double_(0x4130fba800000000,
                      "/workspace/llm4binary/github/license_c_cmakelists/cgreen-devs[P]cgreen/tests/assertion_tests.c"
                      ,0xe0,"1113000",uVar1);
  return;
}

Assistant:

Ensure(double_differences_matter_past_significant_figures) {
    significant_figures_for_assert_double_are(4);
    assert_that_double(1.113, is_not_equal_to_double(1.115));
    assert_that_double(1.113, is_less_than_double(1.115));
    assert_that_double(1.115, is_greater_than_double(1.113));
    assert_that_double(1113, is_not_equal_to_double(1115));
    assert_that_double(1113000, is_not_equal_to_double(1115000));
}